

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

int vrna_hamming_distance(char *s1,char *s2)

{
  int iVar1;
  long lVar2;
  char cVar3;
  
  cVar3 = *s1;
  if (cVar3 == '\0') {
    return 0;
  }
  lVar2 = 0;
  iVar1 = 0;
  do {
    if (s2[lVar2] == '\0') {
      return iVar1;
    }
    iVar1 = iVar1 + (uint)(cVar3 != s2[lVar2]);
    cVar3 = s1[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (cVar3 != '\0');
  return iVar1;
}

Assistant:

PUBLIC int
vrna_hamming_distance(const char  *s1,
                      const char  *s2)
{
  int h = 0;

  for (; *s1 && *s2; s1++, s2++)
    if (*s1 != *s2)
      h++;

  return h;
}